

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *p,Aig_Obj_t *pOut,Aig_Obj_t *pIn)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  int local_34;
  int i;
  uint *pSims1;
  uint *pSims0;
  Aig_Obj_t *pIn_local;
  Aig_Obj_t *pOut_local;
  Ssw_Sml_t *p_local;
  
  iVar2 = Aig_IsComplement(pOut);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pOut)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x366,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_IsComplement(pIn);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pIn)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x367,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_ObjIsCo(pOut);
  if (iVar2 == 0) {
    __assert_fail("Aig_ObjIsCo(pOut)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x368,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_ObjIsCi(pIn);
  if (iVar2 != 0) {
    if (p->nWordsFrame < p->nWordsTotal) {
      puVar3 = Ssw_ObjSim(p,pOut->Id);
      iVar2 = p->nWordsFrame;
      iVar1 = p->nFrames;
      puVar4 = Ssw_ObjSim(p,pIn->Id);
      for (local_34 = 0; local_34 < p->nWordsFrame; local_34 = local_34 + 1) {
        puVar4[local_34] = puVar3[(long)(iVar2 * (iVar1 + -1)) + (long)local_34];
      }
      return;
    }
    __assert_fail("p->nWordsFrame < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x36a,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  __assert_fail("Aig_ObjIsCi(pIn)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0x369,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Ssw_SmlNodeTransferFirst( Ssw_Sml_t * p, Aig_Obj_t * pOut, Aig_Obj_t * pIn )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( !Aig_IsComplement(pOut) );
    assert( !Aig_IsComplement(pIn) );
    assert( Aig_ObjIsCo(pOut) );
    assert( Aig_ObjIsCi(pIn) );
    assert( p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0 = Ssw_ObjSim(p, pOut->Id) + p->nWordsFrame * (p->nFrames-1);
    pSims1 = Ssw_ObjSim(p, pIn->Id);
    // copy information as it is
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims1[i] = pSims0[i];
}